

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

int __thiscall
google::protobuf::io::EpsCopyOutputStream::Flush(EpsCopyOutputStream *this,uint8 *ptr)

{
  uint8 *__src;
  uint8 *puVar1;
  undefined8 uVar2;
  int iVar3;
  uint8 *puVar4;
  int size;
  uint local_44;
  uint8 *local_40;
  uint8 *local_38;
  
  __src = this->buffer_;
  local_40 = this->buffer_ + 0x10;
  do {
    puVar1 = this->end_;
    puVar4 = this->buffer_end_;
    if (puVar4 == (uint8 *)0x0) {
      this->buffer_end_ = ptr;
      return ((int)puVar1 - (int)ptr) + 0x10;
    }
    if (ptr < puVar1 || (long)ptr - (long)puVar1 == 0) {
      memcpy(puVar4,__src,(long)ptr - (long)__src);
      this->buffer_end_ = this->buffer_end_ + ((long)ptr - (long)__src);
      return (int)this->end_ - (int)ptr;
    }
    if (this->stream_ == (ZeroCopyOutputStream *)0x0) {
      this->had_error_ = true;
      this->end_ = local_40;
      return 0;
    }
    memcpy(puVar4,__src,(long)puVar1 - (long)__src);
    do {
      iVar3 = (*this->stream_->_vptr_ZeroCopyOutputStream[2])(this->stream_,&local_38,&local_44);
      if ((char)iVar3 == '\0') {
        this->had_error_ = true;
        puVar4 = local_40;
        goto LAB_001fa188;
      }
    } while ((ulong)local_44 == 0);
    puVar4 = this->end_;
    if ((int)local_44 < 0x11) {
      uVar2 = *(undefined8 *)(puVar4 + 8);
      *(undefined8 *)__src = *(undefined8 *)puVar4;
      *(undefined8 *)(this->buffer_ + 8) = uVar2;
      this->buffer_end_ = local_38;
      puVar4 = __src + (int)local_44;
LAB_001fa188:
      this->end_ = puVar4;
      puVar4 = __src;
    }
    else {
      uVar2 = *(undefined8 *)(puVar4 + 8);
      *(undefined8 *)local_38 = *(undefined8 *)puVar4;
      *(undefined8 *)(local_38 + 8) = uVar2;
      this->end_ = local_38 + ((ulong)local_44 - 0x10);
      this->buffer_end_ = (uint8 *)0x0;
      puVar4 = local_38;
    }
    ptr = puVar4 + (int)((long)ptr - (long)puVar1);
    if ((this->had_error_ & 1U) != 0) {
      return 0;
    }
  } while( true );
}

Assistant:

int EpsCopyOutputStream::Flush(uint8* ptr) {
  while (buffer_end_ && ptr > end_) {
    int overrun = ptr - end_;
    GOOGLE_DCHECK(!had_error_);
    GOOGLE_DCHECK(overrun <= kSlopBytes);  // NOLINT
    ptr = Next() + overrun;
    if (had_error_) return 0;
  }
  int s;
  if (buffer_end_) {
    std::memcpy(buffer_end_, buffer_, ptr - buffer_);
    buffer_end_ += ptr - buffer_;
    s = end_ - ptr;
  } else {
    // The stream is writing directly in the ZeroCopyOutputStream buffer.
    s = end_ + kSlopBytes - ptr;
    buffer_end_ = ptr;
  }
  GOOGLE_DCHECK(s >= 0);  // NOLINT
  return s;
}